

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O0

void __thiscall
tlx::CmdlineParser::add_opt_param_bytes
          (CmdlineParser *this,string *name,uint64_t *dest,string *desc)

{
  uint64_t *longkey;
  ArgumentBytes64 *this_00;
  reference ppAVar1;
  allocator local_51;
  string local_50;
  ArgumentBytes64 *local_30;
  string *local_28;
  string *desc_local;
  uint64_t *dest_local;
  string *name_local;
  CmdlineParser *this_local;
  
  local_28 = desc;
  desc_local = (string *)dest;
  dest_local = (uint64_t *)name;
  name_local = (string *)this;
  this_00 = (ArgumentBytes64 *)operator_new(0x80);
  longkey = dest_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"",&local_51);
  ArgumentBytes64::ArgumentBytes64
            (this_00,'\0',(string *)longkey,&local_50,local_28,false,(uint64_t *)desc_local);
  local_30 = this_00;
  std::vector<tlx::CmdlineParser::Argument*,std::allocator<tlx::CmdlineParser::Argument*>>::
  emplace_back<tlx::CmdlineParser::ArgumentBytes64*>
            ((vector<tlx::CmdlineParser::Argument*,std::allocator<tlx::CmdlineParser::Argument*>> *)
             &this->param_list_,&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  ppAVar1 = std::
            vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
            ::back(&this->param_list_);
  calc_param_max(this,*ppAVar1);
  return;
}

Assistant:

void CmdlineParser::add_opt_param_bytes(
    const std::string& name, uint64_t& dest, const std::string& desc) {
    param_list_.emplace_back(
        new ArgumentBytes64(0, name, "", desc, false, dest));
    calc_param_max(param_list_.back());
}